

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetSensMaxNonlinIters(void *ida_mem,int maxcorS)

{
  int iVar1;
  int error_code;
  undefined4 in_register_00000034;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    iVar1 = 0x3cd;
  }
  else {
    if (*(long *)((long)ida_mem + 0x6e8) != 0) {
      iVar1 = SUNNonlinSolSetMaxIters
                        (*(long *)((long)ida_mem + 0x6e8),CONCAT44(in_register_00000034,maxcorS));
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    error_code = -0x15;
    iVar1 = 0x3d6;
  }
  IDAProcessError((IDAMem)0x0,error_code,iVar1,"IDASetSensMaxNonlinIters",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetSensMaxNonlinIters(void* ida_mem, int maxcorS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* check that the NLS is non-NULL */
  if (IDA_mem->NLSstg == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  return (SUNNonlinSolSetMaxIters(IDA_mem->NLSstg, maxcorS));
}